

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void SerializeMany<VectorWriter,int,unsigned_long,long,unsigned_long,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long,std::__cxx11::string,int,bool>
               (VectorWriter *s,int *args,unsigned_long *args_1,long *args_2,unsigned_long *args_3,
               ParamsWrapper<CNetAddr::SerParams,_CService> *args_4,unsigned_long *args_5,
               ParamsWrapper<CNetAddr::SerParams,_CService> *args_6,unsigned_long *args_7,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_8,int *args_9
               ,bool *args_10)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ser_writedata32<VectorWriter>(s,*args);
  ser_writedata64<VectorWriter>(s,*args_1);
  ser_writedata64<VectorWriter>(s,*args_2);
  ser_writedata64<VectorWriter>(s,*args_3);
  ParamsWrapper<CNetAddr::SerParams,_CService>::Serialize<VectorWriter>(args_4,s);
  ser_writedata64<VectorWriter>(s,*args_5);
  ParamsWrapper<CNetAddr::SerParams,_CService>::Serialize<VectorWriter>(args_6,s);
  ser_writedata64<VectorWriter>(s,*args_7);
  Serialize<VectorWriter,char>(s,args_8);
  ser_writedata32<VectorWriter>(s,*args_9);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    Serialize<VectorWriter>(s,*args_10);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}